

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsItemHovered(ImGuiHoveredFlags flags)

{
  ImGuiWindow *window_00;
  bool bVar1;
  uint in_EDI;
  ImGuiWindow *window;
  ImGuiContext *g;
  bool local_1;
  
  window_00 = GImGui->CurrentWindow;
  if (((GImGui->NavDisableMouseHover & 1U) == 0) || ((GImGui->NavDisableHighlight & 1U) != 0)) {
    if (((window_00->DC).LastItemStatusFlags & 1U) == 0) {
      local_1 = false;
    }
    else if ((GImGui->HoveredRootWindow == window_00->RootWindow) || ((in_EDI & 0x40) != 0)) {
      if ((((in_EDI & 0x20) == 0) &&
          (((GImGui->ActiveId != 0 && (GImGui->ActiveId != (window_00->DC).LastItemId)) &&
           ((GImGui->ActiveIdAllowOverlap & 1U) == 0)))) && (GImGui->ActiveId != window_00->MoveId))
      {
        local_1 = false;
      }
      else {
        bVar1 = IsWindowContentHoverable(window_00,in_EDI);
        if (bVar1) {
          if ((((window_00->DC).ItemFlags & 4U) == 0) || ((in_EDI & 0x80) != 0)) {
            if (((window_00->DC).LastItemId == window_00->MoveId) &&
               ((window_00->WriteAccessed & 1U) != 0)) {
              local_1 = false;
            }
            else {
              local_1 = true;
            }
          }
          else {
            local_1 = false;
          }
        }
        else {
          local_1 = false;
        }
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = IsItemFocused();
  }
  return local_1;
}

Assistant:

bool ImGui::IsItemHovered(ImGuiHoveredFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (g.NavDisableMouseHover && !g.NavDisableHighlight)
        return IsItemFocused();

    // Test for bounding box overlap, as updated as ItemAdd()
    if (!(window->DC.LastItemStatusFlags & ImGuiItemStatusFlags_HoveredRect))
        return false;
    IM_ASSERT((flags & (ImGuiHoveredFlags_RootWindow | ImGuiHoveredFlags_ChildWindows)) == 0);   // Flags not supported by this function

    // Test if we are hovering the right window (our window could be behind another window)
    // [2017/10/16] Reverted commit 344d48be3 and testing RootWindow instead. I believe it is correct to NOT test for RootWindow but this leaves us unable to use IsItemHovered() after EndChild() itself.
    // Until a solution is found I believe reverting to the test from 2017/09/27 is safe since this was the test that has been running for a long while.
    //if (g.HoveredWindow != window)
    //    return false;
    if (g.HoveredRootWindow != window->RootWindow && !(flags & ImGuiHoveredFlags_AllowWhenOverlapped))
        return false;

    // Test if another item is active (e.g. being dragged)
    if (!(flags & ImGuiHoveredFlags_AllowWhenBlockedByActiveItem))
        if (g.ActiveId != 0 && g.ActiveId != window->DC.LastItemId && !g.ActiveIdAllowOverlap && g.ActiveId != window->MoveId)
            return false;

    // Test if interactions on this window are blocked by an active popup or modal
    if (!IsWindowContentHoverable(window, flags))
        return false;

    // Test if the item is disabled
    if ((window->DC.ItemFlags & ImGuiItemFlags_Disabled) && !(flags & ImGuiHoveredFlags_AllowWhenDisabled))
        return false;

    // Special handling for the 1st item after Begin() which represent the title bar. When the window is collapsed (SkipItems==true) that last item will never be overwritten so we need to detect tht case.
    if (window->DC.LastItemId == window->MoveId && window->WriteAccessed)
        return false;
    return true;
}